

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_build_canonical_arrays(uint64_t *cw_lens,uint64_t max_cw_length)

{
  int64_t left_shift;
  uint64_t *pp;
  uint64_t *p;
  uint64_t *q;
  uint64_t max_cw_length_local;
  uint64_t *cw_lens_local;
  
  q = shuff_offset;
  shuff_offset[0] = 0;
  for (p = cw_lens + 1; p < cw_lens + max_cw_length; p = p + 1) {
    q[1] = *q + *p;
    q = q + 1;
  }
  *(undefined8 *)(&DAT_001f96e8 + max_cw_length * 8) = 0;
  p = cw_lens + max_cw_length;
  for (q = (uint64_t *)(&std::__ioinit + max_cw_length * 8); (uint64_t *)0x1f96ef < q; q = q + -1) {
    *q = q[1] + *p >> 1;
    p = p + -1;
  }
  pp = shuff_min_code;
  left_shift = 0x3f;
  p = cw_lens + 1;
  for (q = shuff_lj_base; q < shuff_lj_base + max_cw_length; q = q + 1) {
    if (*p == 0) {
      *q = q[-1];
    }
    else {
      *q = *pp << ((byte)left_shift & 0x3f);
    }
    p = p + 1;
    pp = pp + 1;
    left_shift = left_shift + -1;
  }
  q = shuff_lj_base;
  for (p = cw_lens + 1; *p == 0; p = p + 1) {
    *q = 0xffffffffffffffff;
    q = q + 1;
  }
  return;
}

Assistant:

void shuff_build_canonical_arrays(uint64_t* cw_lens, uint64_t max_cw_length)
{
    uint64_t* q;
    uint64_t* p;

    // build offset
    q = shuff_offset;
    *q = 0;
    for (p = cw_lens + 1; p < cw_lens + max_cw_length; p++, q++)
        *(q + 1) = *q + *p;

    // generate the min_code array
    // min_code[i] = (min_code[i+1] + cw_lens[i+2]) >>1
    q = shuff_min_code + max_cw_length - 1;
    *q = 0;
    for (q--, p = cw_lens + max_cw_length; q >= shuff_min_code; q--, p--)
        *q = (*(q + 1) + *p) >> 1;

    // generate the lj_base array
    q = shuff_lj_base;
    uint64_t* pp = shuff_min_code;
    int64_t left_shift = (sizeof(uint64_t) << 3) - 1;
    for (p = cw_lens + 1; q < shuff_lj_base + max_cw_length;
         p++, q++, pp++, left_shift--)
        if (*p == 0)
            *q = *(q - 1);
        else
            *q = (*pp) << left_shift;
    for (p = cw_lens + 1, q = shuff_lj_base; *p == 0; p++, q++)
        *q = SHUFF_MAX_ULONG;
}